

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall QListWidgetItem::setData(QListWidgetItem *this,int role,QVariant *value)

{
  int *piVar1;
  QListWidgetItemPrivate *pQVar2;
  QWidgetItemData *pQVar3;
  char cVar4;
  long lVar5;
  pointer pQVar6;
  QListModel *this_00;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  initializer_list<int> args;
  size_type sStack_70;
  int local_60 [2];
  undefined1 local_58 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (role == 2) {
    role = 0;
  }
  pQVar2 = this->d;
  lVar7 = (pQVar2->values).d.size + 1;
  lVar8 = 0x20;
  lVar5 = 0;
  do {
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) {
      local_58._0_4_ = role;
      ::QVariant::QVariant((QVariant *)&aStack_50,value);
      QList<QWidgetItemData>::emplaceBack<QWidgetItemData>
                (&pQVar2->values,(QWidgetItemData *)local_58);
      ::QVariant::~QVariant((QVariant *)&aStack_50);
      goto LAB_00520a8e;
    }
    lVar8 = lVar8 + -0x28;
    pQVar3 = (pQVar2->values).d.ptr;
    piVar1 = (int *)((long)&pQVar3->role + lVar5);
    lVar5 = lVar5 + 0x28;
  } while (*piVar1 != role);
  cVar4 = ::QVariant::equals((QVariant *)((long)pQVar3 - lVar8));
  if (cVar4 == '\0') {
    pQVar6 = QList<QWidgetItemData>::data(&this->d->values);
    ::QVariant::operator=((QVariant *)((long)pQVar6 - lVar8),value);
LAB_00520a8e:
    this_00 = listModel(this);
    if (this_00 != (QListModel *)0x0) {
      aStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      aStack_50.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      if (role == 0) {
        local_60[0] = 0;
        local_60[1] = 2;
        sStack_70 = 2;
      }
      else {
        local_60[0] = role;
        sStack_70 = 1;
      }
      args._M_array = local_60;
      args._M_len = sStack_70;
      QList<int>::QList((QList<int> *)local_58,args);
      QListModel::itemChanged(this_00,this,(QList<int> *)local_58);
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetItem::setData(int role, const QVariant &value)
{
    bool found = false;
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < d->values.size(); ++i) {
        if (d->values.at(i).role == role) {
            if (d->values.at(i).value == value)
                return;
            d->values[i].value = value;
            found = true;
            break;
        }
    }
    if (!found)
        d->values.append(QWidgetItemData(role, value));
    if (QListModel *model = listModel()) {
        const QList<int> roles((role == Qt::DisplayRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->itemChanged(this, roles);
    }
}